

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_24(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_100;
  shared_ptr<LNode> local_f0;
  shared_ptr<LNode> local_e0;
  shared_ptr<LNode> local_d0;
  LNodeF0Stmt local_c0;
  undefined4 local_7c;
  shared_ptr<LNodeData<LNodeF0Stmt>_> r;
  shared_ptr<LNode> stmts;
  shared_ptr<LNode> to_expr;
  undefined1 local_38 [8];
  shared_ptr<LNode> from_expr;
  shared_ptr<LNode> var;
  LParser *this_local;
  
  get_node((LParser *)&from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  get_node((LParser *)local_38,in_ESI);
  get_node((LParser *)&stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  get_node((LParser *)
           &r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  local_7c = 0x2b;
  std::shared_ptr<LNode>::shared_ptr
            (&local_d0,
             (shared_ptr<LNode> *)
             &from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr(&local_e0,(shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::shared_ptr
            (&local_f0,
             (shared_ptr<LNode> *)
             &stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr
            (&local_100,
             (shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LNodeF0Stmt::LNodeF0Stmt(&local_c0,&local_d0,&local_e0,&local_f0,&local_100);
  std::make_shared<LNodeData<LNodeF0Stmt>,LNodeType,LNodeF0Stmt>
            ((LNodeType *)&stack0xffffffffffffff88,(LNodeF0Stmt *)&stack0xffffffffffffff84);
  LNodeF0Stmt::~LNodeF0Stmt(&local_c0);
  std::shared_ptr<LNode>::~shared_ptr(&local_100);
  std::shared_ptr<LNode>::~shared_ptr(&local_f0);
  std::shared_ptr<LNode>::~shared_ptr(&local_e0);
  std::shared_ptr<LNode>::~shared_ptr(&local_d0);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeF0Stmt>,void>
            ((shared_ptr<LNode> *)this,
             (shared_ptr<LNodeData<LNodeF0Stmt>_> *)&stack0xffffffffffffff88);
  std::shared_ptr<LNodeData<LNodeF0Stmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeF0Stmt>_> *)&stack0xffffffffffffff88);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_24() {
    // F0Stmt : FOR Var EQUAL Expr TO Expr DO Brs Stmts END Brs
    auto var = this->get_node(10);
    auto from_expr = this->get_node(8);
    auto to_expr = this->get_node(6);
    auto stmts = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeF0Stmt>>(
            LNodeType::F0Stmt,
            LNodeF0Stmt(std::move(var), std::move(from_expr), std::move(to_expr), std::move(stmts))
    );
    return r;
}